

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

char * __thiscall
adios2::format::BP5Deserializer::BreakdownVarName
          (BP5Deserializer *this,char *Name,DataType *type_p,int *element_size_p)

{
  long lVar1;
  undefined4 *in_RCX;
  int *in_RDX;
  long in_RSI;
  long Type;
  long n;
  char *p;
  char *local_28;
  undefined4 *local_20;
  int *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  lVar1 = strtol((char *)(in_RSI + 4),&local_28,10);
  *local_20 = (int)lVar1;
  local_28 = local_28 + 1;
  lVar1 = strtol(local_28,&local_28,10);
  *local_18 = (int)lVar1;
  local_28 = local_28 + 1;
  if (*local_18 == 0x10) {
    local_28 = strchr(local_28,0x5f);
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

const char *BP5Deserializer::BreakdownVarName(const char *Name, DataType *type_p,
                                              int *element_size_p)
{
    // const char *NameStart = strchr(strchr(Name + 4, '_') + 1, '_') + 1;
    // sscanf(Name + 4, "%d_%d", &ElementSize, &Type);
    /* string formatted as bp5_%d_%d_actualname */
    char *p;
    // + 3 to skip BP5_ or bp5_ prefix
    long n = strtol(Name + 4, &p, 10);
    *element_size_p = static_cast<int>(n);
    ++p; // skip '_'
    long Type = strtol(p, &p, 10);
    *type_p = (DataType)Type;
    ++p; // skip '_'
    if (*type_p == DataType::Struct)
    {
        p = strchr(p, '_');
        ++p;
    }
    return p;
}